

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall
helics::CommonCore::getFlagOption(CommonCore *this,LocalFederateId federateID,int32_t flag)

{
  string_view message;
  bool bVar1;
  short *psVar2;
  element_type *this_00;
  size_t sVar3;
  FederateState *pFVar4;
  undefined8 uVar5;
  int in_EDX;
  BaseType in_ESI;
  char *in_RDI;
  FederateState *fed;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffffa4;
  CommonCore *in_stack_ffffffffffffffa8;
  LocalFederateId local_30;
  bool local_2b;
  short local_2a;
  int local_24;
  short *local_20;
  short local_12;
  int local_c;
  short *local_8;
  
  switch(in_EDX) {
  case 0xc:
  case 0xe:
  case 0x1b:
    local_2b = false;
    break;
  default:
    local_30.fid = in_ESI;
    bVar1 = LocalFederateId::operator==(&local_30,(LocalFederateId)0xfffffefd);
    if (bVar1) {
      if (in_EDX == 0x114) {
        this_00 = CLI::std::
                  __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x492120);
        LogManager::getLogBuffer(this_00);
        sVar3 = LogBuffer::capacity((LogBuffer *)0x492130);
        local_2b = sVar3 != 0;
      }
      else {
        local_2b = false;
      }
    }
    else {
      pFVar4 = getFederateAt(in_stack_ffffffffffffffa8,local_30);
      if (pFVar4 == (FederateState *)0x0) {
        uVar5 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff80,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        message._M_len._4_4_ = in_stack_ffffffffffffff8c;
        message._M_len._0_4_ = in_stack_ffffffffffffff88;
        message._M_str = in_RDI;
        InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffff80,message)
        ;
        __cxa_throw(uVar5,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
      }
      local_2b = FederateState::getOptionFlag
                           ((FederateState *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    }
    break;
  case 0x1f:
  case 0x58:
  case 0x59:
    local_2b = BrokerBase::getFlagValue
                         ((BrokerBase *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (int32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    break;
  case 0x2d:
    psVar2 = (short *)(in_RDI + 0x3e4);
    local_24 = 5;
    local_20 = psVar2;
    std::operator&(seq_cst,__memory_order_mask);
    if (local_24 - 1U < 2) {
      local_2a = *psVar2;
    }
    else if (local_24 == 5) {
      local_2a = *psVar2;
    }
    else {
      local_2a = *psVar2;
    }
    local_2b = local_2a != 0;
    break;
  case 0x2f:
    psVar2 = (short *)(in_RDI + 0x3e4);
    local_c = 5;
    local_8 = psVar2;
    std::operator&(seq_cst,__memory_order_mask);
    if (local_c - 1U < 2) {
      local_12 = *psVar2;
    }
    else if (local_c == 5) {
      local_12 = *psVar2;
    }
    else {
      local_12 = *psVar2;
    }
    local_2b = local_12 == 0;
  }
  return local_2b;
}

Assistant:

bool CommonCore::getFlagOption(LocalFederateId federateID, int32_t flag) const
{
    switch (flag) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            return (delayInitCounter.load() == 0);
        case defs::Flags::DELAY_INIT_ENTRY:
            return (delayInitCounter.load() != 0);
        case defs::Flags::DUMPLOG:
        case defs::Flags::FORCE_LOGGING_FLUSH:
        case defs::Flags::DEBUGGING:
            return getFlagValue(flag);
        case defs::Flags::FORWARD_COMPUTE:
        case defs::Flags::SINGLE_THREAD_FEDERATE:
        case defs::Flags::ROLLBACK:
            return false;
        default:
            break;
    }
    if (federateID == gLocalCoreId) {
        if (flag == defs::Properties::LOG_BUFFER) {
            return (mLogManager->getLogBuffer().capacity() > 0);
        }
        return false;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setTimeDelta)"));
    }
    return fed->getOptionFlag(flag);
}